

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowUnmarkCone(Aig_Man_t *p,Vec_Ptr_t *vCone)

{
  ulong uVar1;
  long lVar2;
  
  if (0 < vCone->nSize) {
    lVar2 = 0;
    do {
      uVar1 = *(ulong *)((long)vCone->pArray[lVar2] + 0x18);
      if (((uint)uVar1 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x3ea,"void Llb_ManFlowUnmarkCone(Aig_Man_t *, Vec_Ptr_t *)");
      }
      if ((uVar1 & 0x20) == 0) {
        __assert_fail("pObj->fMarkB == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x3eb,"void Llb_ManFlowUnmarkCone(Aig_Man_t *, Vec_Ptr_t *)");
      }
      *(ulong *)((long)vCone->pArray[lVar2] + 0x18) = uVar1 & 0xffffffffffffffdf;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vCone->nSize);
  }
  return;
}

Assistant:

void Llb_ManFlowUnmarkCone( Aig_Man_t * p, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCone, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        assert( pObj->fMarkB == 1 );
        pObj->fMarkB = 0;
    }
}